

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O1

ResultValue * __thiscall
ComplexType::toResultValue
          (ResultValue *__return_storage_ptr__,ComplexType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  long *plVar1;
  long *plVar2;
  ResultValue *pRVar3;
  int iVar4;
  NumericChars *pNVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bool bVar8;
  bool bVar9;
  long **pplVar10;
  long **pplVar11;
  long **pplVar12;
  size_t i;
  ulong uVar13;
  char *__end;
  double dVar14;
  Complex value;
  string realPart;
  string imaginaryPart;
  long *local_88;
  long *local_80;
  char *local_78;
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  double local_40;
  ResultValue *local_38;
  
  pplVar10 = &local_88;
  pplVar11 = &local_88;
  pplVar12 = &local_88;
  local_80 = local_70;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"","");
  bVar8 = true;
  bVar9 = false;
  for (uVar13 = 0; pNVar5 = NumericConstant::chars(numericConstant), plVar1 = local_80,
      uVar13 < (ulong)((long)(pNVar5->
                             super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pNVar5->
                            super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                            )._M_impl.super__Vector_impl_data._M_start); uVar13 = uVar13 + 1) {
    pNVar5 = NumericConstant::chars(numericConstant);
    numChar = (pNVar5->super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar13];
    if (numChar < A) {
LAB_00138683:
      NumericConstantChars::getChar(numChar);
      std::__cxx11::string::push_back((char)(string *)&local_80);
    }
    else if (numChar - 0x10 < 2) {
      if (uVar13 == 0) goto LAB_00138683;
      std::__cxx11::string::_M_assign((string *)&local_80);
      bVar8 = false;
    }
    else {
      if (numChar == DecimalPoint) goto LAB_00138683;
      if ((numChar == ImaginaryUnit) && (bVar9 = true, bVar8)) {
        std::__cxx11::string::_M_assign((string *)local_60);
        std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x13a9d7);
      }
    }
  }
  if (bVar9) {
    iVar4 = std::__cxx11::string::compare((char *)&local_80);
    plVar1 = local_80;
    if (iVar4 == 0) {
      pplVar10 = (long **)0x13a9d7;
      iVar4 = std::__cxx11::string::compare((char *)local_60);
      plVar1 = local_60[0];
      uVar7 = extraout_RDX_00;
      if (iVar4 == 0) {
LAB_00138878:
        pRVar3 = local_38;
        value._M_value._8_8_ = uVar7;
        value._M_value._0_8_ = pplVar10;
        ResultValue::ResultValue(local_38,value);
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        return pRVar3;
      }
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      *piVar6 = 0;
      strtod((char *)plVar1,(char **)&local_88);
      if (local_88 != plVar1) {
        uVar7 = extraout_RDX_01;
        pplVar10 = pplVar11;
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        else if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stod");
        }
        goto LAB_00138878;
      }
      goto LAB_001388f3;
    }
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    dVar14 = strtod((char *)plVar1,(char **)&local_88);
    plVar2 = local_60[0];
    if (local_88 == plVar1) goto LAB_001388db;
    local_40 = dVar14;
    if (*piVar6 == 0) {
      *piVar6 = iVar4;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stod");
    }
    iVar4 = *piVar6;
    *piVar6 = 0;
    strtod((char *)local_60[0],(char **)&local_88);
    if (local_88 != plVar2) {
      uVar7 = extraout_RDX_02;
      pplVar10 = pplVar12;
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stod");
      }
      goto LAB_00138878;
    }
  }
  else {
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    strtod((char *)plVar1,(char **)&local_88);
    if (local_88 != plVar1) {
      uVar7 = extraout_RDX;
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stod");
      }
      goto LAB_00138878;
    }
    std::__throw_invalid_argument("stod");
LAB_001388db:
    std::__throw_invalid_argument("stod");
  }
  std::__throw_invalid_argument("stod");
LAB_001388f3:
  uVar7 = std::__throw_invalid_argument("stod");
  if (*piVar6 == 0) {
    *piVar6 = iVar4;
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

ResultValue ComplexType::toResultValue(const NumericConstant& numericConstant) const {
	std::string realPart = "";
	std::string imaginaryPart = "";
	std::string& currentPart = realPart;
	bool atRealPart = true;
	bool isComplex = false;

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				currentPart += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					currentPart = imaginaryPart;
					atRealPart = false;
				} else {
					currentPart += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				if (atRealPart) {
					imaginaryPart = realPart;
					realPart = "";
				}

				isComplex = true;
				break;
			default:
				break;
		}
	}

	if (isComplex) {
		if (realPart != "") {
			return Complex(std::stod(realPart), std::stod(imaginaryPart));
		} else if (imaginaryPart != "") {
			return Complex(0.0, std::stod(imaginaryPart));
		} else {
			return Complex(0.0, 1.0);
		}
	} else {
		return Complex(std::stod(realPart), 0.0);
	}
}